

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::update<QRegion>(QWidgetPrivate *this,QRegion r)

{
  uint uVar1;
  long lVar2;
  QWidget *this_00;
  long lVar3;
  char cVar4;
  QWidget *pQVar5;
  QUpdateLaterEvent *this_01;
  long in_FS_OFFSET;
  QRegion clipped;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  uVar1 = this_00->data->widget_attributes;
  if (((*(uint *)&this->field_0x250 >> 0x18 & 1) == 0) || ((uVar1 & 0x8000) != 0)) {
    if ((uVar1 & 0x8400) == 0x8000) {
      clipped.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QWidget::rect(this_00);
      QRegion::operator&(&clipped,(QRect *)r.d);
      cVar4 = QRegion::isEmpty();
      if (cVar4 == '\0') {
        if ((*(byte *)(*(long *)&this_00->field_0x8 + 0x243) & 0x40) == 0) {
          pQVar5 = QWidget::window(this_00);
          lVar3 = *(long *)(*(long *)&pQVar5->field_0x8 + 0x78);
          if ((((lVar3 != 0) && (lVar3 = *(long *)(lVar3 + 8), lVar3 != 0)) &&
              (*(long *)(lVar3 + 0x10) != 0)) &&
             (*(QWidgetRepaintManager **)(lVar3 + 8) != (QWidgetRepaintManager *)0x0)) {
            QWidgetRepaintManager::markDirty<QRegion>
                      (*(QWidgetRepaintManager **)(lVar3 + 8),&clipped,this_00,UpdateLater,
                       BufferValid);
          }
        }
        else {
          this_01 = (QUpdateLaterEvent *)operator_new(0x18);
          QUpdateLaterEvent::QUpdateLaterEvent(this_01,&clipped);
          QCoreApplication::postEvent(&this_00->super_QObject,(QEvent *)this_01,0);
        }
      }
      QRegion::~QRegion(&clipped);
    }
  }
  else {
    *(uint *)&this->field_0x250 = *(uint *)&this->field_0x250 | 0x8000000;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::update(T r)
{
    Q_Q(QWidget);

    if (renderToTexture && !q->isVisible()) {
        renderToTextureReallyDirty = 1;
        return;
    }

    if (!q->isVisible() || !q->updatesEnabled())
        return;

    T clipped = r & q->rect();

    if (clipped.isEmpty())
        return;

    if (q->testAttribute(Qt::WA_WState_InPaintEvent)) {
        QCoreApplication::postEvent(q, new QUpdateLaterEvent(clipped));
        return;
    }

    QTLWExtra *tlwExtra = q->window()->d_func()->maybeTopData();
    if (tlwExtra && tlwExtra->backingStore && tlwExtra->repaintManager)
        tlwExtra->repaintManager->markDirty(clipped, q);
}